

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

MDD lddmc_union_cube_copy(MDD a,uint32_t *values,int *copy,size_t count)

{
  uint8_t uVar1;
  uint32_t uVar2;
  mddnode_t n;
  uint64_t uVar3;
  MDD MVar4;
  MDD down_1;
  MDD right_1;
  uint32_t na_value;
  MDD right;
  MDD down;
  int na_copy;
  mddnode_t na;
  size_t count_local;
  int *copy_local;
  uint32_t *values_local;
  MDD a_local;
  
  if (a == 0) {
    a_local = lddmc_cube_copy(values,copy,count);
  }
  else if (a == 1) {
    if (count != 0) {
      __assert_fail("count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x711,"MDD lddmc_union_cube_copy(MDD, uint32_t *, int *, size_t)");
    }
    a_local = 1;
  }
  else {
    if (count == 0) {
      __assert_fail("count != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x714,"MDD lddmc_union_cube_copy(MDD, uint32_t *, int *, size_t)");
    }
    n = LDD_GETNODE(a);
    uVar1 = mddnode_getcopy(n);
    a_local = a;
    if ((uVar1 == '\0') || (*copy == 0)) {
      if (uVar1 == '\0') {
        if (*copy == 0) {
          uVar2 = mddnode_getvalue(n);
          if (uVar2 < *values) {
            uVar3 = mddnode_getright(n);
            MVar4 = lddmc_union_cube_copy(uVar3,values,copy,count);
            uVar3 = mddnode_getright(n);
            if (MVar4 != uVar3) {
              uVar3 = mddnode_getdown(n);
              a_local = lddmc_makenode(uVar2,uVar3,MVar4);
            }
          }
          else if (uVar2 == *values) {
            uVar3 = mddnode_getdown(n);
            MVar4 = lddmc_union_cube_copy(uVar3,values + 1,copy + 1,count - 1);
            uVar3 = mddnode_getdown(n);
            if (MVar4 != uVar3) {
              uVar3 = mddnode_getright(n);
              a_local = lddmc_makenode(uVar2,MVar4,uVar3);
            }
          }
          else {
            uVar2 = *values;
            MVar4 = lddmc_cube_copy(values + 1,copy + 1,count - 1);
            a_local = lddmc_makenode(uVar2,MVar4,a);
          }
        }
        else {
          MVar4 = lddmc_cube_copy(values + 1,copy + 1,count - 1);
          a_local = lddmc_make_copynode(MVar4,a);
        }
      }
      else {
        uVar3 = mddnode_getright(n);
        MVar4 = lddmc_union_cube_copy(uVar3,values,copy,count);
        uVar3 = mddnode_getright(n);
        if (MVar4 != uVar3) {
          uVar3 = mddnode_getdown(n);
          a_local = lddmc_make_copynode(uVar3,MVar4);
        }
      }
    }
    else {
      uVar3 = mddnode_getdown(n);
      MVar4 = lddmc_union_cube_copy(uVar3,values + 1,copy + 1,count - 1);
      uVar3 = mddnode_getdown(n);
      if (MVar4 != uVar3) {
        uVar3 = mddnode_getright(n);
        a_local = lddmc_make_copynode(MVar4,uVar3);
      }
    }
  }
  return a_local;
}

Assistant:

MDD
lddmc_union_cube_copy(MDD a, uint32_t* values, int* copy, size_t count)
{
    if (a == lddmc_false) return lddmc_cube_copy(values, copy, count);
    if (a == lddmc_true) {
        assert(count == 0);
        return lddmc_true;
    }
    assert(count != 0);

    mddnode_t na = LDD_GETNODE(a);

    /* Only create a new node if something actually changed */

    int na_copy = mddnode_getcopy(na);
    if (na_copy && *copy) {
        MDD down = lddmc_union_cube_copy(mddnode_getdown(na), values+1, copy+1, count-1);
        if (down == mddnode_getdown(na)) return a; // no actual change
        return lddmc_make_copynode(down, mddnode_getright(na));
    } else if (na_copy) {
        MDD right = lddmc_union_cube_copy(mddnode_getright(na), values, copy, count);
        if (right == mddnode_getright(na)) return a; // no actual change
        return lddmc_make_copynode(mddnode_getdown(na), right);
    } else if (*copy) {
        return lddmc_make_copynode(lddmc_cube_copy(values+1, copy+1, count-1), a);
    }

    uint32_t na_value = mddnode_getvalue(na);
    if (na_value < *values) {
        MDD right = lddmc_union_cube_copy(mddnode_getright(na), values, copy, count);
        if (right == mddnode_getright(na)) return a; // no actual change
        return lddmc_makenode(na_value, mddnode_getdown(na), right);
    } else if (na_value == *values) {
        MDD down = lddmc_union_cube_copy(mddnode_getdown(na), values+1, copy+1, count-1);
        if (down == mddnode_getdown(na)) return a; // no actual change
        return lddmc_makenode(na_value, down, mddnode_getright(na));
    } else /* na_value > *values */ {
        return lddmc_makenode(*values, lddmc_cube_copy(values+1, copy+1, count-1), a);
    }
}